

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab8-0.c
# Opt level: O0

TTestcaseData GetFromTestcase(uint testcaseIdx,ETestcaseDataId dataId,uint edgeIdx)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint local_50;
  uint local_4c;
  uint column;
  uint row;
  uint partTwoEdgeCount_1;
  uint partOneEdgeCount_1;
  int bias;
  int slope;
  uint partTwoEdgeCount;
  uint partOneEdgeCount;
  TSmallTest *test;
  uint smallTestCount;
  uint edgeIdx_local;
  ETestcaseDataId dataId_local;
  uint testcaseIdx_local;
  
  test._0_4_ = 0x1e;
  test._4_4_ = edgeIdx;
  smallTestCount = dataId;
  edgeIdx_local = testcaseIdx;
  if (testcaseIdx < 0x1e) {
    uVar3 = (ulong)testcaseIdx;
    _partTwoEdgeCount = GetFromTestcase::smallTests + uVar3;
    switch(dataId) {
    case VERTEX_COUNT:
      _dataId_local = MakeInteger((ulong)_partTwoEdgeCount->VertexCount);
      break;
    case EDGE_COUNT:
      _dataId_local = MakeInteger((ulong)GetFromTestcase::smallTests[uVar3].EdgeCount);
      break;
    case EDGE:
      if (GetFromTestcase::smallTests[uVar3].EdgeCount <= edgeIdx) {
        __assert_fail("edgeIdx < test->EdgeCount",
                      "/workspace/llm4binary/github/license_c_cmakelists/Evgueni-Petrov-aka-espetrov[P]TestDriver/testlab8-0.c"
                      ,0x9b,
                      "TTestcaseData GetFromTestcase(unsigned int, enum ETestcaseDataId, unsigned int)"
                     );
      }
      _dataId_local =
           MakeEdge(*(uint *)(uVar3 * 0x98 + 0x106c08 + (ulong)edgeIdx * 0x10),
                    _partTwoEdgeCount->Edges[edgeIdx].End,_partTwoEdgeCount->Edges[edgeIdx].Length);
      break;
    case ERROR_MESSAGE:
      _dataId_local = MakeString(GetFromTestcase::smallTests[uVar3].Message);
      break;
    case MST_LENGTH:
      _dataId_local = MakeInteger(GetFromTestcase::smallTests[uVar3].MstLength);
      break;
    default:
      abort();
    }
  }
  else if (testcaseIdx == 0x1e) {
    switch(dataId) {
    case VERTEX_COUNT:
    case EDGE_COUNT:
      _dataId_local = MakeInteger(5000);
      break;
    case EDGE:
      if (4999 < edgeIdx) {
        __assert_fail("edgeIdx < MAX_VERTEX_COUNT",
                      "/workspace/llm4binary/github/license_c_cmakelists/Evgueni-Petrov-aka-espetrov[P]TestDriver/testlab8-0.c"
                      ,0xaa,
                      "TTestcaseData GetFromTestcase(unsigned int, enum ETestcaseDataId, unsigned int)"
                     );
      }
      _dataId_local = MakeEdge(edgeIdx + 1,(edgeIdx + 1) % 5000 + 1,(ulong)(edgeIdx + 1));
      break;
    case ERROR_MESSAGE:
      _dataId_local = MakeString((char *)0x0);
      break;
    case MST_LENGTH:
      uVar1 = SumRange(1,4999);
      _dataId_local = MakeInteger((ulong)uVar1);
      break;
    default:
      abort();
    }
  }
  else if ((testcaseIdx == 0x1f) || (testcaseIdx == 0x20)) {
    slope = 0x1386;
    bias = 0x1385;
    partOneEdgeCount_1 = ((testcaseIdx == 0x1c) - 1) + (uint)(testcaseIdx == 0x1c);
    partTwoEdgeCount_1 = 0x1389;
    if (testcaseIdx == 0x1c) {
      partTwoEdgeCount_1 = 0;
    }
    switch(dataId) {
    case VERTEX_COUNT:
      _dataId_local = MakeInteger(5000);
      break;
    case EDGE_COUNT:
      _dataId_local = MakeInteger(0x270c);
      break;
    case EDGE:
      if (0x270b < edgeIdx) {
        __assert_fail("edgeIdx < partOneEdgeCount + partTwoEdgeCount + 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/Evgueni-Petrov-aka-espetrov[P]TestDriver/testlab8-0.c"
                      ,0xbe,
                      "TTestcaseData GetFromTestcase(unsigned int, enum ETestcaseDataId, unsigned int)"
                     );
      }
      if (edgeIdx < 0x1386) {
        _dataId_local =
             MakeEdge((edgeIdx + 1) * partOneEdgeCount_1 + partTwoEdgeCount_1,
                      (edgeIdx + 2) * partOneEdgeCount_1 + partTwoEdgeCount_1,(ulong)(edgeIdx + 1));
      }
      else if (edgeIdx < 0x270b) {
        _dataId_local =
             MakeEdge(partOneEdgeCount_1 + partTwoEdgeCount_1,
                      (edgeIdx - 0x1383) * partOneEdgeCount_1 + partTwoEdgeCount_1,
                      (ulong)(edgeIdx + 3));
      }
      else {
        _dataId_local =
             MakeEdge(partOneEdgeCount_1 * 4999 + partTwoEdgeCount_1,
                      partOneEdgeCount_1 * 5000 + partTwoEdgeCount_1,0x270e);
      }
      break;
    case ERROR_MESSAGE:
      _dataId_local = MakeString((char *)0x0);
      break;
    case MST_LENGTH:
      uVar1 = SumRange(1,0x1386);
      _dataId_local = MakeInteger((ulong)(uVar1 + 0x270e));
      break;
    default:
      abort();
    }
  }
  else {
    if (testcaseIdx != 0x21) {
      abort();
    }
    row = 0x1386;
    column = SumRange(4000,0x1385);
    switch(smallTestCount) {
    case 0:
      _dataId_local = MakeInteger(5000);
      break;
    case 1:
      _dataId_local = MakeInteger((ulong)(column + 4999));
      break;
    case 2:
      if (column + 4999 <= test._4_4_) {
        __assert_fail("edgeIdx < partOneEdgeCount + partTwoEdgeCount + 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/Evgueni-Petrov-aka-espetrov[P]TestDriver/testlab8-0.c"
                      ,0xd6,
                      "TTestcaseData GetFromTestcase(unsigned int, enum ETestcaseDataId, unsigned int)"
                     );
      }
      if (test._4_4_ < 0x1386) {
        _dataId_local = MakeEdge(test._4_4_ + 1,test._4_4_ + 2,(ulong)(test._4_4_ + 1));
      }
      else if (test._4_4_ < column + 0x1386) {
        iVar2 = test._4_4_ - 0x1386;
        uVar1 = SumRange(0,3999);
        CalcRowColumn(iVar2 + uVar1,&local_4c,&local_50);
        iVar2 = -local_4c;
        local_4c = iVar2 + 5000;
        _dataId_local = MakeEdge(iVar2 + 0x1385,local_50 + local_4c,4999);
      }
      else {
        _dataId_local = MakeEdge(4999,5000,5000);
      }
      break;
    case 3:
      _dataId_local = MakeString((char *)0x0);
      break;
    case 4:
      _dataId_local = MakeInteger(0xbeb25d);
      break;
    default:
      abort();
    }
  }
  return _dataId_local;
}

Assistant:

static TTestcaseData GetFromTestcase(unsigned testcaseIdx, enum ETestcaseDataId dataId, unsigned edgeIdx) {
    const unsigned smallTestCount = 30;
    if (testcaseIdx < smallTestCount) {
        typedef struct TSmallTest {
            unsigned VertexCount;
            unsigned EdgeCount;
            struct TEdge Edges[8];
            const char* Message;
            unsigned long long MstLength;
        } TSmallTest;

        static const TSmallTest smallTests[] = {
            {3, 3, {{1, 2, 10}, {2, 3, 5}, {3, 1, 5}}, NULL, 10},
            {3, 1, {{1, 2, 10}}, "no spanning tree"},
            {2, 1, {{IGNORED_VERTEX_IDX}}, "bad number of lines"},

            {0, 0, {{IGNORED_VERTEX_IDX}}, "no spanning tree"},
            {MAX_VERTEX_COUNT+1, 1, {{1, 1, 1}}, "bad number of vertices"},
            {2, 4, {{1, 1, 1}, {1, 2, 1}, {2, 1, 1}, {2, 2, 1}}, "bad number of edges"},
            {2, 2, {{1, 2, 2}, {1, 2, 1}}, "bad number of edges"},
            {2, 1, {{1, 2, (unsigned long long)-1}}, "bad length"},

            {2, 0, {{IGNORED_VERTEX_IDX}}, "no spanning tree"},
            {2, 1, {{1, 2, (unsigned long long)4*INT_MAX}}, "bad length"},
            {4, 2, {{1, 2, INT_MAX}, {2, 3, INT_MAX}}, "no spanning tree"},
            {2, 1, {{1, 1, INT_MAX}}, "no spanning tree"},

            {1, 0, {{IGNORED_VERTEX_IDX}}, NULL, 0},
            {4, 4, {{1, 2, 1}, {2, 3, 2}, {3, 4, 4}, {4, 1, 8}}, NULL, 7},
            {3, 2, {{1, 2, INT_MAX}, {2, 3, INT_MAX}}, NULL, 2ull * INT_MAX},
            {3, 3, {{1, 2, INT_MAX}, {2, 3, INT_MAX}, {1, 3, 1}}, NULL, 1ull + INT_MAX},

            {4, 4, {{1, 2, INT_MAX}, {2, 3, INT_MAX}, {3, 4, INT_MAX}, {4, 1, INT_MAX}}, NULL, 3ull * INT_MAX},
            {4, 4, {{1, 2, 1u << 28}, {2, 3, 2u << 28}, {3, 4, 3u << 28}, {4, 1, 4u << 28}}, NULL, 6ull << 28},
            {4, 4, {{1, 2, (1u << 28) + 4}, {2, 3, (2u << 28) + 3}, {3, 4, (3u << 28) + 2}, {4, 1, (4u << 28) + 1}}, NULL, (6ull << 28) + 9},
            {4, 4, {{1, 2, 1}, {2, 3, 1}, {3, 4, 1}, {4, 1, 1}}, NULL, 3},
            {5, 4, {{1, 2, 1}, {2, 3, 1}, {3, 1, 1}, {4, 3, 1}}, "no spanning tree"},
            {4, 6, {{1, 2, 1}, {1, 3, 2}, {1, 4, 4}, {2, 3, 8}, {2, 4, 16}, {3, 4, 32}}, NULL, 7},

            {3, 2, {{1, 2, 1}, {2, 4, 1}}, "bad vertex"},
            {3, 2, {{1, 2, 1}, {4, 2, 1}}, "bad vertex"},
            {3, 2, {{1, 2, 1}, {(unsigned)-1, 2, 1}}, "bad vertex"},
            {3, 2, {{1, 2, 1}, {2, (unsigned)-1, 1}}, "bad vertex"},

            {4, 4, {{1, 2, 1}, {2, 3, 2}, {1, 3, 3}, {4, 3, 4}}, NULL, 7},
            {4, 3, {{1, 2, 1}, {3, 4, 2}, {2, 4, 3}}, NULL, 6},
            {6, 6, {{1, 2, 1}, {2, 3, 2}, {4, 5, 3}, {5, 6, 4}, {3, 4, 5}, {1, 6, 6}}, NULL, 15},

            {6, 6, {{1, 2, 1}, {3, 4, 2}, {5, 6, 3}, {2, 3, 4}, {4, 5, 5}, {1, 6, 6}}, NULL, 15},
        };
        if (smallTestCount != sizeof(smallTests) / sizeof(smallTests[0])) {
            abort();
        }
        const TSmallTest* test = &smallTests[testcaseIdx];
        switch (dataId) {
            case VERTEX_COUNT:
                return MakeInteger(test->VertexCount);
            case EDGE_COUNT:
                return MakeInteger(test->EdgeCount);
            case EDGE:
                assert(edgeIdx < test->EdgeCount);
                return MakeEdge(test->Edges[edgeIdx].Begin, test->Edges[edgeIdx].End, test->Edges[edgeIdx].Length);
            case ERROR_MESSAGE:
                return MakeString(test->Message);
            case MST_LENGTH:
                return MakeInteger(test->MstLength);
            default:
                abort();
        }
    } else if (testcaseIdx == smallTestCount) {
        switch (dataId) {
            case VERTEX_COUNT:
            case EDGE_COUNT:
                return MakeInteger(MAX_VERTEX_COUNT);
            case EDGE:
                assert(edgeIdx < MAX_VERTEX_COUNT);
                return MakeEdge(edgeIdx + 1, (edgeIdx + 1) % MAX_VERTEX_COUNT + 1, edgeIdx + 1);
            case ERROR_MESSAGE:
                return MakeString(NULL);
            case MST_LENGTH:
                return MakeInteger(SumRange(1, MAX_VERTEX_COUNT - 1));
            default:
                abort();
        }
    } else if (testcaseIdx == smallTestCount + 1 || testcaseIdx == smallTestCount + 2) {
        const unsigned partOneEdgeCount = MAX_VERTEX_COUNT - 2;
        const unsigned partTwoEdgeCount = MAX_VERTEX_COUNT - 3;
        const int slope = testcaseIdx == 28 ? 1 : -1;
        const int bias = testcaseIdx == 28 ? 0 : MAX_VERTEX_COUNT + 1;
        switch (dataId) {
            case VERTEX_COUNT:
                return MakeInteger(MAX_VERTEX_COUNT);
            case EDGE_COUNT:
                return MakeInteger(partOneEdgeCount + partTwoEdgeCount + 1);
            case EDGE:
                assert(edgeIdx < partOneEdgeCount + partTwoEdgeCount + 1);
                if (edgeIdx < partOneEdgeCount) {
                    return MakeEdge((edgeIdx + 1) * slope + bias, (edgeIdx + 2) * slope + bias, edgeIdx + 1);
                } else if (edgeIdx < partOneEdgeCount + partTwoEdgeCount) {
                    return MakeEdge(1 * slope + bias, (edgeIdx - partOneEdgeCount + 3) * slope + bias, edgeIdx + 3);
                } else {
                    return MakeEdge((MAX_VERTEX_COUNT - 1) * slope + bias, MAX_VERTEX_COUNT * slope + bias, 2 * MAX_VERTEX_COUNT - 2);
                }
            case ERROR_MESSAGE:
                return MakeString(NULL);
            case MST_LENGTH:
                return MakeInteger(SumRange(1, MAX_VERTEX_COUNT - 2) + 2 * MAX_VERTEX_COUNT - 2);
            default:
                abort();
        }
    } else if (testcaseIdx == smallTestCount + 3) {
        const unsigned partOneEdgeCount = MAX_VERTEX_COUNT - 2;
        const unsigned partTwoEdgeCount = SumRange(MAX_VERTEX_COUNT * 4 / 5, MAX_VERTEX_COUNT - 3);
        switch (dataId) {
            case VERTEX_COUNT:
                return MakeInteger(MAX_VERTEX_COUNT);
            case EDGE_COUNT:
                return MakeInteger(partOneEdgeCount + partTwoEdgeCount + 1);
            case EDGE:
                assert(edgeIdx < partOneEdgeCount + partTwoEdgeCount + 1);
                if (edgeIdx < partOneEdgeCount) {
                    return MakeEdge(edgeIdx + 1, edgeIdx + 2, edgeIdx + 1);
                } else if (edgeIdx < partOneEdgeCount + partTwoEdgeCount) {
                    unsigned row, column;
                    CalcRowColumn(edgeIdx - partOneEdgeCount + SumRange(0, MAX_VERTEX_COUNT * 4 / 5 - 1), &row, &column); // row = N * 4 / 5 ... N - 3, column = 0 ... row
                    row = MAX_VERTEX_COUNT - row;
                    return MakeEdge(row - 3, column + row, MAX_VERTEX_COUNT - 1);
                } else {
                    return MakeEdge(MAX_VERTEX_COUNT - 1, MAX_VERTEX_COUNT, MAX_VERTEX_COUNT);
                }
            case ERROR_MESSAGE:
                return MakeString(NULL);
            case MST_LENGTH:
                return MakeInteger((MAX_VERTEX_COUNT - 1) * (MAX_VERTEX_COUNT - 2) / 2 + MAX_VERTEX_COUNT);
            default:
                abort();
        }
    } else {
        abort();
    }
}